

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

bool spvtools::utils::operator==
               (SmallVector<unsigned_int,_2UL> *lhs,SmallVector<unsigned_int,_2UL> *rhs)

{
  uint **ppuVar1;
  size_t sVar2;
  size_t sVar3;
  const_iterator puVar4;
  uint **ppuVar5;
  uint *puVar6;
  const_iterator puVar7;
  bool bVar8;
  
  sVar2 = SmallVector<unsigned_int,_2UL>::size(lhs);
  sVar3 = SmallVector<unsigned_int,_2UL>::size(rhs);
  if (sVar2 == sVar3) {
    ppuVar1 = (uint **)(rhs->large_data_)._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar5 = &rhs->small_data_;
    if (ppuVar1 != (uint **)0x0) {
      ppuVar5 = ppuVar1;
    }
    puVar6 = *ppuVar5;
    ppuVar1 = (uint **)(lhs->large_data_)._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar5 = &lhs->small_data_;
    if (ppuVar1 != (uint **)0x0) {
      ppuVar5 = ppuVar1;
    }
    puVar7 = *ppuVar5;
    while( true ) {
      puVar4 = SmallVector<unsigned_int,_2UL>::end(lhs);
      bVar8 = puVar7 == puVar4;
      if ((bVar8) || (*puVar7 != *puVar6)) break;
      puVar7 = puVar7 + 1;
      puVar6 = puVar6 + 1;
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool operator==(const SmallVector& lhs, const OtherVector& rhs) {
    if (lhs.size() != rhs.size()) {
      return false;
    }

    auto rit = rhs.begin();
    for (auto lit = lhs.begin(); lit != lhs.end(); ++lit, ++rit) {
      if (*lit != *rit) {
        return false;
      }
    }
    return true;
  }